

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::SetArgsFromPreset(cmCTest *this,string *presetName,bool listPresets)

{
  _Base_ptr __k;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  byte bVar3;
  int iVar4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var7;
  ReadFileResult result;
  iterator iVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *kvp;
  string_view separator;
  undefined1 local_2c8 [16];
  _Rb_tree_node_base local_2b8;
  string indexOptions;
  allocator<char> local_263;
  allocator<char> local_262;
  allocator<char> local_261;
  string local_260;
  string workingDirectory;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  presetEnvironment;
  cmCMakePresetsGraph settingsFile;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  settingsFile.errors._M_dataplus._M_p = (pointer)&settingsFile.errors.field_2;
  settingsFile.errors._M_string_length = 0;
  settingsFile.errors.field_2._M_local_buf[0] = '\0';
  p_Var1 = &settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.SourceDir._M_dataplus._M_p = (pointer)&settingsFile.SourceDir.field_2;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.SourceDir._M_string_length = 0;
  settingsFile.SourceDir.field_2._M_local_buf[0] = '\0';
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  result = cmCMakePresetsGraph::ReadProjectPresets(&settingsFile,&workingDirectory,false);
  if (result != READ_OK) {
    presetEnvironment._M_t._M_impl._0_8_ = 0x1c;
    presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_3bbaee;
    indexOptions._M_dataplus._M_p = (pointer)workingDirectory._M_string_length;
    indexOptions._M_string_length = (size_type)workingDirectory._M_dataplus._M_p;
    local_260._M_dataplus._M_p = cmCMakePresetsGraph::ResultToString(result);
    cmStrCat<char[3],char_const*>
              ((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,(cmAlphaNum *)&indexOptions,
               (char (*) [3])0x65d8d7,(char **)&local_260);
    cmSystemTools::Error((string *)local_2c8);
LAB_0044de9d:
    std::__cxx11::string::~string((string *)local_2c8);
    bVar11 = false;
    goto LAB_0044e122;
  }
  if (listPresets) {
    bVar11 = true;
    cmCMakePresetsGraph::PrintTestPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
    goto LAB_0044e122;
  }
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          ::find(&settingsFile.TestPresets._M_t,presetName);
  if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
    presetEnvironment._M_t._M_impl._0_8_ = 0x17;
    presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_191012b;
    indexOptions._M_dataplus._M_p = (pointer)workingDirectory._M_string_length;
    indexOptions._M_string_length = (size_type)workingDirectory._M_dataplus._M_p;
    local_260._M_dataplus._M_p._0_1_ = 0x22;
    cmStrCat<char[4],std::__cxx11::string,char>
              ((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,(cmAlphaNum *)&indexOptions,
               (char (*) [4])0x67336c,presetName,(char *)&local_260);
    cmSystemTools::Error((string *)local_2c8);
  }
  else {
    if ((char)iVar8._M_node[4]._M_color != _S_black) {
      if (*(char *)&iVar8._M_node[0x3a]._M_left == '\0') {
        presetEnvironment._M_t._M_impl._0_8_ = 0x20;
        presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             anon_var_dwarf_1910152;
        indexOptions._M_string_length = (size_type)(presetName->_M_dataplus)._M_p;
        indexOptions._M_dataplus._M_p = (pointer)presetName->_M_string_length;
        cmStrCat<char[27]>((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,
                           (cmAlphaNum *)&indexOptions,(char (*) [27])"\": Invalid macro expansion")
        ;
        cmSystemTools::Error((string *)local_2c8);
      }
      else {
        if (*(char *)&iVar8._M_node[0x23]._M_parent != '\0') {
          __k = iVar8._M_node + 0x25;
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                  ::find(&settingsFile.ConfigurePresets._M_t,__k);
          if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
            presetEnvironment._M_t._M_impl._0_8_ = 0x1c;
            presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 anon_var_dwarf_3c2bf2;
            indexOptions._M_dataplus._M_p = (pointer)workingDirectory._M_string_length;
            indexOptions._M_string_length = (size_type)workingDirectory._M_dataplus._M_p;
            local_260._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      ((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,
                       (cmAlphaNum *)&indexOptions,(char (*) [4])0x67336c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                       (char *)&local_260);
            cmSystemTools::Error((string *)local_2c8);
          }
          else {
            if ((char)iVar9._M_node[4]._M_color != _S_black) {
              if ((char)iVar9._M_node[0x21]._M_color == _S_red) {
                presetEnvironment._M_t._M_impl._0_8_ = 0x25;
                presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     anon_var_dwarf_3c2c0c;
                indexOptions._M_string_length = *(size_type *)(iVar8._M_node + 0x25);
                indexOptions._M_dataplus._M_p = (pointer)iVar8._M_node[0x25]._M_parent;
                cmStrCat<char[27]>((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,
                                   (cmAlphaNum *)&indexOptions,
                                   (char (*) [27])"\": Invalid macro expansion");
                cmSystemTools::Error((string *)local_2c8);
                goto LAB_0044de9d;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::_Rb_tree(&presetEnvironment._M_t,
                         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&iVar8._M_node[0x23]._M_left);
              for (p_Var10 = presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var10 !=
                  &presetEnvironment._M_t._M_impl.super__Rb_tree_header;
                  p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
                if ((char)p_Var10[3]._M_color == _S_black) {
                  indexOptions._M_string_length = *(size_type *)(p_Var10 + 1);
                  indexOptions._M_dataplus._M_p = (pointer)p_Var10[1]._M_parent;
                  local_2c8._0_8_ = &DAT_00000001;
                  local_2c8._8_8_ = &local_2b8;
                  local_2b8._M_color._0_1_ = '=';
                  cmStrCat<std::__cxx11::string>
                            (&local_260,(cmAlphaNum *)&indexOptions,(cmAlphaNum *)local_2c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var10 + 2));
                  cmsys::SystemTools::PutEnv(&local_260);
                  std::__cxx11::string::~string((string *)&local_260);
                }
              }
              if (iVar8._M_node[0x26]._M_left != (_Base_ptr)0x0) {
                SetConfigType(this,(string *)&iVar8._M_node[0x26]._M_parent);
              }
              indexOptions._M_dataplus._M_p = (pointer)0xf;
              indexOptions._M_string_length = (size_type)anon_var_dwarf_19101a0;
              local_2c8._8_8_ = iVar9._M_node[0x1c]._M_right;
              local_2c8._0_8_ = *(undefined8 *)(iVar9._M_node + 0x1d);
              cmStrCat<>(&local_260,(cmAlphaNum *)&indexOptions,(cmAlphaNum *)local_2c8);
              AddCTestConfigurationOverwrite(this,&local_260);
              std::__cxx11::string::~string((string *)&local_260);
              p_Var6 = iVar8._M_node[0x27]._M_left;
              for (p_Var10 = iVar8._M_node[0x27]._M_parent; p_Var10 != p_Var6; p_Var10 = p_Var10 + 1
                  ) {
                AddCTestConfigurationOverwrite(this,(string *)p_Var10);
              }
              if ((char)iVar8._M_node[0x2c]._M_color != _S_red) {
                _Var7._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                (_Var7._M_head_impl)->TestProgressOutput =
                     (bool)(*(byte *)((long)&iVar8._M_node[0x28]._M_color + 1) &
                           (char)iVar8._M_node[0x28]._M_color);
                if (*(char *)&iVar8._M_node[0x28]._M_parent == '\x01') {
                  if (*(int *)&iVar8._M_node[0x28].field_0x4 != 1) {
                    if (*(int *)&iVar8._M_node[0x28].field_0x4 != 2) goto LAB_0044e389;
                    (_Var7._M_head_impl)->ExtraVerbose = true;
                  }
                  (_Var7._M_head_impl)->Verbose = true;
                }
LAB_0044e389:
                bVar3 = *(byte *)((long)&iVar8._M_node[0x28]._M_parent + 5);
                (_Var7._M_head_impl)->Debug =
                     (bool)(*(byte *)((long)&iVar8._M_node[0x28]._M_parent + 4) & bVar3);
                (_Var7._M_head_impl)->ShowLineNumbers =
                     (bool)(bVar3 & *(byte *)((long)&iVar8._M_node[0x28]._M_parent + 4));
                (_Var7._M_head_impl)->OutputTestOutputOnTestFailure =
                     (bool)(*(byte *)((long)&iVar8._M_node[0x28]._M_parent + 7) &
                           *(byte *)((long)&iVar8._M_node[0x28]._M_parent + 6));
                (_Var7._M_head_impl)->Quiet =
                     (bool)(*(byte *)((long)&iVar8._M_node[0x28]._M_left + 1) &
                           *(byte *)&iVar8._M_node[0x28]._M_left);
                if (*(long *)(iVar8._M_node + 0x29) != 0) {
                  SetOutputLogFileName(this,(string *)&iVar8._M_node[0x28]._M_right);
                }
                if (*(long *)(iVar8._M_node + 0x2a) != 0) {
                  SetOutputJUnitFileName(this,(string *)&iVar8._M_node[0x29]._M_right);
                }
                _Var7._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                bVar11 = (bool)(*(byte *)&iVar8._M_node[0x2a]._M_right & 1);
                if (*(char *)((long)&iVar8._M_node[0x2a]._M_right + 1) == '\0') {
                  bVar11 = true;
                }
                (_Var7._M_head_impl)->LabelSummary = bVar11;
                bVar11 = (bool)(*(byte *)((long)&iVar8._M_node[0x2a]._M_right + 2) & 1);
                if (*(char *)((long)&iVar8._M_node[0x2a]._M_right + 3) == '\0') {
                  bVar11 = true;
                }
                (_Var7._M_head_impl)->SubprojectSummary = bVar11;
                if ((char)iVar8._M_node[0x2b]._M_color == _S_black) {
                  *(int *)((long)&(_Var7._M_head_impl)->TestHandler + 0x1ac) =
                       *(int *)((long)&iVar8._M_node[0x2a]._M_right + 4);
                }
                if (*(char *)&iVar8._M_node[0x2b]._M_parent == '\x01') {
                  *(int *)((long)&(_Var7._M_head_impl)->TestHandler + 0x1b0) =
                       *(int *)&iVar8._M_node[0x2b].field_0x4;
                }
                if (*(char *)&iVar8._M_node[0x2b]._M_left == '\x01') {
                  *(TruncationMode *)((long)&(_Var7._M_head_impl)->TestHandler + 0x1b4) =
                       *(TruncationMode *)((long)&iVar8._M_node[0x2b]._M_parent + 4);
                }
                if (*(char *)&iVar8._M_node[0x2b]._M_right == '\x01') {
                  (_Var7._M_head_impl)->MaxTestNameWidth =
                       *(int *)((long)&iVar8._M_node[0x2b]._M_left + 4);
                }
              }
              if ((char)iVar8._M_node[0x37]._M_color == _S_black) {
                if (*(char *)&iVar8._M_node[0x31]._M_parent == '\x01') {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&indexOptions,"IncludeRegularExpression",
                             (allocator<char> *)local_2c8);
                  SetPersistentOptionIfNotEmpty
                            (this,(string *)&iVar8._M_node[0x2c]._M_parent,&indexOptions);
                  std::__cxx11::string::~string((string *)&indexOptions);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&indexOptions,"LabelRegularExpression",
                             (allocator<char> *)local_2c8);
                  AddPersistentMultiOptionIfNotEmpty
                            (this,(string *)&iVar8._M_node[0x2d]._M_parent,&indexOptions);
                  std::__cxx11::string::~string((string *)&indexOptions);
                  if (*(char *)&iVar8._M_node[0x30]._M_right == '\x01') {
                    if (*(long *)(iVar8._M_node + 0x30) == 0) {
                      indexOptions._M_dataplus._M_p = (pointer)&indexOptions.field_2;
                      indexOptions._M_string_length = 0;
                      indexOptions.field_2._M_local_buf[0] = '\0';
                      if (*(char *)((long)&iVar8._M_node[0x2e]._M_parent + 4) == '\x01') {
                        std::__cxx11::to_string(&local_260,*(int *)&iVar8._M_node[0x2e]._M_parent);
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,"",&local_261);
                      }
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2c8,&local_260,",");
                      std::__cxx11::string::append((string *)&indexOptions);
                      std::__cxx11::string::~string((string *)local_2c8);
                      std::__cxx11::string::~string((string *)&local_260);
                      if (*(char *)((long)&iVar8._M_node[0x2e]._M_left + 4) == '\x01') {
                        std::__cxx11::to_string(&local_260,*(int *)&iVar8._M_node[0x2e]._M_left);
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,"",&local_262);
                      }
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2c8,&local_260,",");
                      std::__cxx11::string::append((string *)&indexOptions);
                      std::__cxx11::string::~string((string *)local_2c8);
                      std::__cxx11::string::~string((string *)&local_260);
                      if (*(char *)((long)&iVar8._M_node[0x2e]._M_right + 4) == '\x01') {
                        std::__cxx11::to_string(&local_260,*(int *)&iVar8._M_node[0x2e]._M_right);
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,"",&local_263);
                      }
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2c8,&local_260,",");
                      std::__cxx11::string::append((string *)&indexOptions);
                      std::__cxx11::string::~string((string *)local_2c8);
                      std::__cxx11::string::~string((string *)&local_260);
                      separator._M_str = ",";
                      separator._M_len = 1;
                      cmJoin<std::vector<int,std::allocator<int>>>
                                ((string *)local_2c8,
                                 (vector<int,_std::allocator<int>_> *)(iVar8._M_node + 0x2f),
                                 separator);
                      std::__cxx11::string::append((string *)&indexOptions);
                      std::__cxx11::string::~string((string *)local_2c8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_2c8,"TestsToRunInformation",
                                 (allocator<char> *)&local_260);
                      SetPersistentOptionIfNotEmpty(this,&indexOptions,(string *)local_2c8);
                      std::__cxx11::string::~string((string *)local_2c8);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&indexOptions,"TestsToRunInformation",
                                 (allocator<char> *)local_2c8);
                      SetPersistentOptionIfNotEmpty
                                (this,(string *)&iVar8._M_node[0x2f]._M_right,&indexOptions);
                    }
                    std::__cxx11::string::~string((string *)&indexOptions);
                  }
                  if ((*(byte *)((long)&iVar8._M_node[0x31]._M_color + 1) == 1) &&
                     ((iVar8._M_node[0x31]._M_color & _S_black) != _S_red)) {
                    _Var7._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&indexOptions,"UseUnion",(allocator<char> *)local_2c8);
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var7._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               &indexOptions,"true");
                    std::__cxx11::string::~string((string *)&indexOptions);
                    _Var7._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&indexOptions,"UseUnion",(allocator<char> *)local_2c8);
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var7._M_head_impl)->MemCheckHandler,
                               &indexOptions,"true");
                    std::__cxx11::string::~string((string *)&indexOptions);
                  }
                }
                if (*(char *)&iVar8._M_node[0x36]._M_right == '\x01') {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&indexOptions,"ExcludeRegularExpression",
                             (allocator<char> *)local_2c8);
                  SetPersistentOptionIfNotEmpty
                            (this,(string *)&iVar8._M_node[0x31]._M_left,&indexOptions);
                  std::__cxx11::string::~string((string *)&indexOptions);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&indexOptions,"ExcludeLabelRegularExpression",
                             (allocator<char> *)local_2c8);
                  AddPersistentMultiOptionIfNotEmpty
                            (this,(string *)&iVar8._M_node[0x32]._M_left,&indexOptions);
                  std::__cxx11::string::~string((string *)&indexOptions);
                  if (*(char *)&iVar8._M_node[0x36]._M_left == '\x01') {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&indexOptions,"ExcludeFixtureRegularExpression",
                               (allocator<char> *)local_2c8);
                    SetPersistentOptionIfNotEmpty
                              (this,(string *)&iVar8._M_node[0x33]._M_left,&indexOptions);
                    std::__cxx11::string::~string((string *)&indexOptions);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&indexOptions,"ExcludeFixtureSetupRegularExpression",
                               (allocator<char> *)local_2c8);
                    SetPersistentOptionIfNotEmpty
                              (this,(string *)&iVar8._M_node[0x34]._M_left,&indexOptions);
                    std::__cxx11::string::~string((string *)&indexOptions);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&indexOptions,"ExcludeFixtureCleanupRegularExpression",
                               (allocator<char> *)local_2c8);
                    SetPersistentOptionIfNotEmpty
                              (this,(string *)&iVar8._M_node[0x35]._M_left,&indexOptions);
                    std::__cxx11::string::~string((string *)&indexOptions);
                  }
                }
              }
              if (*(char *)&iVar8._M_node[0x3a]._M_parent == '\x01') {
                _Var7._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                (_Var7._M_head_impl)->StopOnFailure =
                     (bool)(*(byte *)((long)&iVar8._M_node[0x37]._M_parent + 1) &
                           *(byte *)&iVar8._M_node[0x37]._M_parent);
                (_Var7._M_head_impl)->Failover =
                     (bool)(*(byte *)((long)&iVar8._M_node[0x37]._M_parent + 3) &
                           *(byte *)((long)&iVar8._M_node[0x37]._M_parent + 2));
                if (*(char *)&iVar8._M_node[0x37]._M_left == '\x01') {
                  iVar4 = *(int *)((long)&iVar8._M_node[0x37]._M_parent + 4);
                  iVar12 = 1;
                  if (1 < iVar4) {
                    iVar12 = iVar4;
                  }
                  (_Var7._M_head_impl)->ParallelLevel = iVar12;
                  (_Var7._M_head_impl)->ParallelLevelSetInCli = true;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&indexOptions,"ResourceSpecFile",(allocator<char> *)local_2c8);
                SetPersistentOptionIfNotEmpty
                          (this,(string *)&iVar8._M_node[0x37]._M_right,&indexOptions);
                std::__cxx11::string::~string((string *)&indexOptions);
                if (*(char *)((long)&iVar8._M_node[0x38]._M_right + 4) == '\x01') {
                  ((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestLoad =
                       (long)*(int *)&iVar8._M_node[0x38]._M_right;
                }
                if (iVar8._M_node[0x39].field_0x4 == '\x01') {
                  _Var7._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  (_Var7._M_head_impl)->ShowOnly = true;
                  if (iVar8._M_node[0x39]._M_color == _S_black) {
                    (_Var7._M_head_impl)->Quiet = true;
                    (_Var7._M_head_impl)->OutputAsJson = true;
                    (_Var7._M_head_impl)->OutputAsJsonVersion = 1;
                  }
                }
                if (*(char *)&iVar8._M_node[0x39]._M_left != '\x01') {
LAB_0044e9c7:
                  if (*(char *)((long)&iVar8._M_node[0x39]._M_left + 5) == '\x01') {
                    ((this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                    InteractiveDebugMode = *(bool *)((long)&iVar8._M_node[0x39]._M_left + 4);
                  }
                  if ((*(char *)((long)&iVar8._M_node[0x39]._M_left + 7) == '\x01') &&
                     (((ulong)iVar8._M_node[0x39]._M_left & 0x1000000000000) != 0)) {
                    std::__cxx11::string::assign
                              ((char *)&((this->Impl)._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl)->ScheduleType);
                  }
                  if (*(char *)((long)&iVar8._M_node[0x39]._M_right + 4) == '\x01') {
                    (((this->Impl)._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->GlobalTimeout
                    ).__r = (double)*(int *)&iVar8._M_node[0x39]._M_right;
                  }
                  if (iVar8._M_node[0x3a].field_0x4 == '\x01') {
                    _Var5 = iVar8._M_node[0x3a]._M_color;
                    if (_Var5 - _S_black < 2) {
                      ((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode
                           = _Var5;
                    }
                    else if (_Var5 != _S_red) goto LAB_0044ea62;
                  }
                  goto LAB_0044ea4e;
                }
                _Var7._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                (_Var7._M_head_impl)->RepeatCount =
                     *(undefined4 *)((long)&iVar8._M_node[0x39]._M_parent + 4);
                if (*(uint *)&iVar8._M_node[0x39]._M_parent < 3) {
                  (_Var7._M_head_impl)->RepeatMode =
                       *(uint *)&iVar8._M_node[0x39]._M_parent + UntilFail;
                  goto LAB_0044e9c7;
                }
LAB_0044ea62:
                bVar11 = false;
              }
              else {
LAB_0044ea4e:
                bVar11 = true;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::~_Rb_tree(&presetEnvironment._M_t);
              goto LAB_0044e122;
            }
            presetEnvironment._M_t._M_impl._0_8_ = 0x26;
            presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 anon_var_dwarf_3c2bff;
            indexOptions._M_dataplus._M_p = (pointer)workingDirectory._M_string_length;
            indexOptions._M_string_length = (size_type)workingDirectory._M_dataplus._M_p;
            local_260._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      ((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,
                       (cmAlphaNum *)&indexOptions,(char (*) [4])0x67336c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                       (char *)&local_260);
            cmSystemTools::Error((string *)local_2c8);
          }
          std::__cxx11::string::~string((string *)local_2c8);
          bVar11 = false;
          cmCMakePresetsGraph::PrintConfigurePresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
          goto LAB_0044e122;
        }
        presetEnvironment._M_t._M_impl._0_8_ = 0x23;
        presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             anon_var_dwarf_191016c;
        indexOptions._M_dataplus._M_p = (pointer)workingDirectory._M_string_length;
        indexOptions._M_string_length = (size_type)workingDirectory._M_dataplus._M_p;
        local_260._M_dataplus._M_p._0_1_ = 0x22;
        cmStrCat<char[4],std::__cxx11::string,char>
                  ((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,(cmAlphaNum *)&indexOptions,
                   (char (*) [4])0x67336c,presetName,(char *)&local_260);
        cmSystemTools::Error((string *)local_2c8);
      }
      std::__cxx11::string::~string((string *)local_2c8);
      bVar11 = false;
      cmCMakePresetsGraph::PrintTestPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
      goto LAB_0044e122;
    }
    presetEnvironment._M_t._M_impl._0_8_ = 0x21;
    presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_1910145;
    indexOptions._M_dataplus._M_p = (pointer)workingDirectory._M_string_length;
    indexOptions._M_string_length = (size_type)workingDirectory._M_dataplus._M_p;
    local_260._M_dataplus._M_p._0_1_ = 0x22;
    cmStrCat<char[4],std::__cxx11::string,char>
              ((string *)local_2c8,(cmAlphaNum *)&presetEnvironment,(cmAlphaNum *)&indexOptions,
               (char (*) [4])0x67336c,presetName,(char *)&local_260);
    cmSystemTools::Error((string *)local_2c8);
  }
  std::__cxx11::string::~string((string *)local_2c8);
  bVar11 = false;
  cmCMakePresetsGraph::PrintTestPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
LAB_0044e122:
  cmCMakePresetsGraph::~cmCMakePresetsGraph(&settingsFile);
  std::__cxx11::string::~string((string *)&workingDirectory);
  return bVar11;
}

Assistant:

bool cmCTest::SetArgsFromPreset(const std::string& presetName,
                                bool listPresets)
{
  const auto workingDirectory = cmSystemTools::GetCurrentWorkingDirectory();

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(workingDirectory);
  if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
    cmSystemTools::Error(
      cmStrCat("Could not read presets from ", workingDirectory, ": ",
               cmCMakePresetsGraph::ResultToString(result)));
    return false;
  }

  if (listPresets) {
    settingsFile.PrintTestPresetList();
    return true;
  }

  auto presetPair = settingsFile.TestPresets.find(presetName);
  if (presetPair == settingsFile.TestPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such test preset in ", workingDirectory,
                                  ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden test preset in ",
                                  workingDirectory, ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate test preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintTestPresetList();
    return false;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled test preset in ",
                                  workingDirectory, ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  auto configurePresetPair =
    settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
  if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
    cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                  workingDirectory, ": \"",
                                  expandedPreset->ConfigurePreset, '"'));
    settingsFile.PrintConfigurePresetList();
    return false;
  }

  if (configurePresetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                  workingDirectory, ": \"",
                                  expandedPreset->ConfigurePreset, '"'));
    settingsFile.PrintConfigurePresetList();
    return false;
  }

  auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
  if (!expandedConfigurePreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                  expandedPreset->ConfigurePreset,
                                  "\": Invalid macro expansion"));
    return false;
  }

  auto presetEnvironment = expandedPreset->Environment;
  for (auto const& var : presetEnvironment) {
    if (var.second) {
      cmSystemTools::PutEnv(cmStrCat(var.first, '=', *var.second));
    }
  }

  if (!expandedPreset->Configuration.empty()) {
    this->SetConfigType(expandedPreset->Configuration);
  }

  // Set build directory to value specified by the configure preset.
  this->AddCTestConfigurationOverwrite(
    cmStrCat("BuildDirectory=", expandedConfigurePreset->BinaryDir));
  for (const auto& kvp : expandedPreset->OverwriteConfigurationFile) {
    this->AddCTestConfigurationOverwrite(kvp);
  }

  if (expandedPreset->Output) {
    this->Impl->TestProgressOutput =
      expandedPreset->Output->ShortProgress.value_or(false);

    if (expandedPreset->Output->Verbosity) {
      const auto& verbosity = *expandedPreset->Output->Verbosity;
      switch (verbosity) {
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Extra:
          this->Impl->ExtraVerbose = true;
          CM_FALLTHROUGH;
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Verbose:
          this->Impl->Verbose = true;
          break;
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Default:
        default:
          // leave default settings
          break;
      }
    }

    this->Impl->Debug = expandedPreset->Output->Debug.value_or(false);
    this->Impl->ShowLineNumbers =
      expandedPreset->Output->Debug.value_or(false);
    this->Impl->OutputTestOutputOnTestFailure =
      expandedPreset->Output->OutputOnFailure.value_or(false);
    this->Impl->Quiet = expandedPreset->Output->Quiet.value_or(false);

    if (!expandedPreset->Output->OutputLogFile.empty()) {
      this->SetOutputLogFileName(expandedPreset->Output->OutputLogFile);
    }
    if (!expandedPreset->Output->OutputJUnitFile.empty()) {
      this->SetOutputJUnitFileName(expandedPreset->Output->OutputJUnitFile);
    }

    this->Impl->LabelSummary =
      expandedPreset->Output->LabelSummary.value_or(true);
    this->Impl->SubprojectSummary =
      expandedPreset->Output->SubprojectSummary.value_or(true);

    if (expandedPreset->Output->MaxPassedTestOutputSize) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        *expandedPreset->Output->MaxPassedTestOutputSize);
    }

    if (expandedPreset->Output->MaxFailedTestOutputSize) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        *expandedPreset->Output->MaxFailedTestOutputSize);
    }

    if (expandedPreset->Output->TestOutputTruncation) {
      this->Impl->TestHandler.TestOutputTruncation =
        *expandedPreset->Output->TestOutputTruncation;
    }

    if (expandedPreset->Output->MaxTestNameWidth) {
      this->Impl->MaxTestNameWidth = *expandedPreset->Output->MaxTestNameWidth;
    }
  }

  if (expandedPreset->Filter) {
    if (expandedPreset->Filter->Include) {
      this->SetPersistentOptionIfNotEmpty(
        expandedPreset->Filter->Include->Name, "IncludeRegularExpression");
      this->AddPersistentMultiOptionIfNotEmpty(
        expandedPreset->Filter->Include->Label, "LabelRegularExpression");

      if (expandedPreset->Filter->Include->Index) {
        if (expandedPreset->Filter->Include->Index->IndexFile.empty()) {
          const auto& start = expandedPreset->Filter->Include->Index->Start;
          const auto& end = expandedPreset->Filter->Include->Index->End;
          const auto& stride = expandedPreset->Filter->Include->Index->Stride;
          std::string indexOptions;
          indexOptions += (start ? std::to_string(*start) : "") + ",";
          indexOptions += (end ? std::to_string(*end) : "") + ",";
          indexOptions += (stride ? std::to_string(*stride) : "") + ",";
          indexOptions +=
            cmJoin(expandedPreset->Filter->Include->Index->SpecificTests, ",");

          this->SetPersistentOptionIfNotEmpty(indexOptions,
                                              "TestsToRunInformation");
        } else {
          this->SetPersistentOptionIfNotEmpty(
            expandedPreset->Filter->Include->Index->IndexFile,
            "TestsToRunInformation");
        }
      }

      if (expandedPreset->Filter->Include->UseUnion.value_or(false)) {
        this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
        this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
      }
    }

    if (expandedPreset->Filter->Exclude) {
      this->SetPersistentOptionIfNotEmpty(
        expandedPreset->Filter->Exclude->Name, "ExcludeRegularExpression");
      this->AddPersistentMultiOptionIfNotEmpty(
        expandedPreset->Filter->Exclude->Label,
        "ExcludeLabelRegularExpression");

      if (expandedPreset->Filter->Exclude->Fixtures) {
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Any,
          "ExcludeFixtureRegularExpression");
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Setup,
          "ExcludeFixtureSetupRegularExpression");
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Cleanup,
          "ExcludeFixtureCleanupRegularExpression");
      }
    }
  }

  if (expandedPreset->Execution) {
    this->Impl->StopOnFailure =
      expandedPreset->Execution->StopOnFailure.value_or(false);
    this->Impl->Failover =
      expandedPreset->Execution->EnableFailover.value_or(false);

    if (expandedPreset->Execution->Jobs) {
      auto jobs = *expandedPreset->Execution->Jobs;
      this->SetParallelLevel(jobs);
      this->Impl->ParallelLevelSetInCli = true;
    }

    this->SetPersistentOptionIfNotEmpty(
      expandedPreset->Execution->ResourceSpecFile, "ResourceSpecFile");

    if (expandedPreset->Execution->TestLoad) {
      auto testLoad = *expandedPreset->Execution->TestLoad;
      this->SetTestLoad(testLoad);
    }

    if (expandedPreset->Execution->ShowOnly) {
      this->Impl->ShowOnly = true;

      switch (*expandedPreset->Execution->ShowOnly) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum::
          JsonV1:
          this->Impl->Quiet = true;
          this->Impl->OutputAsJson = true;
          this->Impl->OutputAsJsonVersion = 1;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum::
          Human:
          // intentional fallthrough (human is the default)
        default:
          break;
      }
    }

    if (expandedPreset->Execution->Repeat) {
      this->Impl->RepeatCount = expandedPreset->Execution->Repeat->Count;
      switch (expandedPreset->Execution->Repeat->Mode) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::UntilFail:
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::UntilPass:
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::AfterTimeout:
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
          break;
        default:
          // should never default since mode is required
          return false;
      }
    }

    if (expandedPreset->Execution->InteractiveDebugging) {
      this->Impl->InteractiveDebugMode =
        *expandedPreset->Execution->InteractiveDebugging;
    }

    if (expandedPreset->Execution->ScheduleRandom.value_or(false)) {
      this->Impl->ScheduleType = "Random";
    }

    if (expandedPreset->Execution->Timeout) {
      this->Impl->GlobalTimeout =
        cmDuration(*expandedPreset->Execution->Timeout);
    }

    if (expandedPreset->Execution->NoTestsAction) {
      switch (*expandedPreset->Execution->NoTestsAction) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Error:
          this->Impl->NoTestsMode = cmCTest::NoTests::Error;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Ignore:
          this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Default:
          break;
        default:
          // should never default
          return false;
      }
    }
  }

  return true;
}